

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_NicknameUUID.cpp
# Opt level: O3

string * calc_uuid_abi_cxx11_(string *__return_storage_ptr__,PlayerInfo *player)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (player->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (player->name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string calc_uuid(RenX::PlayerInfo &player)
{
	return player.name;
}